

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O3

void __thiscall
t_rs_generator::render_sync_client_tthriftclient_impl(t_rs_generator *this,string *client_impl_name)

{
  ofstream_with_content_based_conditional_update *poVar1;
  int *piVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  ostream *poVar4;
  string local_40;
  
  poVar1 = &this->f_gen_;
  t_generator::indent_abi_cxx11_(&local_40,&this->super_t_generator);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,local_40._M_dataplus._M_p,local_40._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"impl ",5);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,SYNC_CLIENT_GENERIC_BOUND_VARS_abi_cxx11_._M_dataplus._M_p,
                      SYNC_CLIENT_GENERIC_BOUND_VARS_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," TThriftClient for ",0x13);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(client_impl_name->_M_dataplus)._M_p,client_impl_name->_M_string_length
                     );
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,SYNC_CLIENT_GENERIC_BOUND_VARS_abi_cxx11_._M_dataplus._M_p,
                      SYNC_CLIENT_GENERIC_BOUND_VARS_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,SYNC_CLIENT_GENERIC_BOUNDS_abi_cxx11_._M_dataplus._M_p,
                      SYNC_CLIENT_GENERIC_BOUNDS_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," {",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  paVar3 = &local_40.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar3) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  piVar2 = &(this->super_t_generator).indent_;
  *piVar2 = *piVar2 + 1;
  t_generator::indent_abi_cxx11_(&local_40,&this->super_t_generator);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,local_40._M_dataplus._M_p,local_40._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"fn i_prot_mut(&mut self) -> &mut dyn TInputProtocol { &mut self._i_prot }",0x49
            );
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar3) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  t_generator::indent_abi_cxx11_(&local_40,&this->super_t_generator);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,local_40._M_dataplus._M_p,local_40._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"fn o_prot_mut(&mut self) -> &mut dyn TOutputProtocol { &mut self._o_prot }",
             0x4a);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar3) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  t_generator::indent_abi_cxx11_(&local_40,&this->super_t_generator);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,local_40._M_dataplus._M_p,local_40._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"fn sequence_number(&self) -> i32 { self._sequence_number }",0x3a);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar3) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  t_generator::indent_abi_cxx11_(&local_40,&this->super_t_generator);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,local_40._M_dataplus._M_p,local_40._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,
             "fn increment_sequence_number(&mut self) -> i32 { self._sequence_number += 1; self._sequence_number }"
             ,100);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar3) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  piVar2 = &(this->super_t_generator).indent_;
  *piVar2 = *piVar2 + -1;
  t_generator::indent_abi_cxx11_(&local_40,&this->super_t_generator);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,local_40._M_dataplus._M_p,local_40._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"}",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar3) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
            );
  return;
}

Assistant:

void t_rs_generator::render_sync_client_tthriftclient_impl(const string &client_impl_name) {
  f_gen_
    << indent()
    << "impl "
    << SYNC_CLIENT_GENERIC_BOUND_VARS
    << " TThriftClient for "
    << client_impl_name
    << SYNC_CLIENT_GENERIC_BOUND_VARS
    << " "
    << SYNC_CLIENT_GENERIC_BOUNDS
    << " {" << endl;
  indent_up();

  f_gen_ << indent() << "fn i_prot_mut(&mut self) -> &mut dyn TInputProtocol { &mut self._i_prot }" << endl;
  f_gen_ << indent() << "fn o_prot_mut(&mut self) -> &mut dyn TOutputProtocol { &mut self._o_prot }" << endl;
  f_gen_ << indent() << "fn sequence_number(&self) -> i32 { self._sequence_number }" << endl;
  f_gen_
    << indent()
    << "fn increment_sequence_number(&mut self) -> i32 { self._sequence_number += 1; self._sequence_number }"
    << endl;

  indent_down();
  f_gen_ << indent() << "}" << endl;
  f_gen_ << endl;
}